

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file,ROMInfo **romInfos)

{
  ROMInfo **ppRVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  ROMInfo *unaff_R12;
  ROMInfo *pRVar6;
  
  iVar3 = (*file->_vptr_File[2])();
  if (*romInfos != (ROMInfo *)0x0) {
    uVar5 = 1;
    pRVar6 = *romInfos;
    do {
      if (CONCAT44(extraout_var,iVar3) == pRVar6->fileSize) {
        iVar4 = (*file->_vptr_File[4])(file);
        iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),*pRVar6->sha1Digest);
        if (iVar4 != 0) goto LAB_001787fc;
        bVar2 = false;
      }
      else {
LAB_001787fc:
        bVar2 = true;
        pRVar6 = unaff_R12;
      }
      if (!bVar2) {
        return pRVar6;
      }
      ppRVar1 = romInfos + uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
      unaff_R12 = pRVar6;
      pRVar6 = *ppRVar1;
    } while (*ppRVar1 != (ROMInfo *)0x0);
  }
  return (ROMInfo *)0x0;
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file, const ROMInfo * const *romInfos) {
	size_t fileSize = file->getSize();
	for (Bit32u i = 0; romInfos[i] != NULL; i++) {
		const ROMInfo *romInfo = romInfos[i];
		if (fileSize == romInfo->fileSize && !strcmp(file->getSHA1(), romInfo->sha1Digest)) {
			return romInfo;
		}
	}
	return NULL;
}